

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

void __thiscall BeliefSparse::SanityCheck(BeliefSparse *this)

{
  BeliefSparse *in_stack_00000078;
  
  SanityCheck(in_stack_00000078);
  return;
}

Assistant:

bool BeliefSparse::SanityCheck() const
{
    // check for negative and entries>1
    double sum=0;
    for(BScit it=_m_b.begin();
        it!=_m_b.end(); ++it)
    {
        if(*it<0)
            return(false);
        if(*it>1 + PROB_PRECISION)
            return(false);
        if(std::isnan(*it))
            return(false);
        sum+=*it;
    }

    // check if sums to 1
    if(abs(sum-1)>PROB_PRECISION)
        return(false);

    // check whether the size is not zero
    if(_m_b.size()==0)
        return(false);

    // if we haven't returned yet, the belief is fine
    return(true);
}